

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void extend_plane_high(uint8_t *src8,int src_stride,int width,int height,int extend_top,
                      int extend_left,int extend_bottom,int extend_right,int v_start,int v_end)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint16_t *dst_ptr2;
  uint16_t *dst_ptr1;
  uint16_t *src_ptr2;
  uint16_t *src_ptr1;
  uint16_t *src;
  int linesize;
  int i;
  void *local_50;
  void *local_48;
  ushort *local_40;
  ushort *local_38;
  int local_20;
  
  iVar1 = in_R9D + (int)dst_ptr1 + in_EDX;
  lVar2 = in_RDI * 2;
  local_38 = (ushort *)(lVar2 + (long)((int)src_ptr2 * in_ESI) * 2);
  local_50 = (void *)(lVar2 + (long)((int)src_ptr2 * in_ESI) * 2 + (long)in_EDX * 2);
  local_40 = (ushort *)((long)local_50 + -2);
  local_48 = (void *)(lVar2 + (long)((int)src_ptr2 * in_ESI) * 2 + (long)in_R9D * -2);
  for (local_20 = (int)src_ptr2; local_20 < (int)src_ptr1; local_20 = local_20 + 1) {
    aom_memset16(local_48,(uint)*local_38,(long)in_R9D);
    aom_memset16(local_50,(uint)*local_40,(long)(int)dst_ptr1);
    local_38 = local_38 + in_ESI;
    local_40 = local_40 + in_ESI;
    local_48 = (void *)((long)local_48 + (long)in_ESI * 2);
    local_50 = (void *)((long)local_50 + (long)in_ESI * 2);
  }
  pvVar3 = (void *)(lVar2 + (long)in_R9D * -2);
  local_48 = (void *)((long)pvVar3 + (long)(in_ESI * -in_R8D) * 2);
  for (local_20 = 0; local_20 < in_R8D; local_20 = local_20 + 1) {
    memcpy(local_48,pvVar3,(long)iVar1 << 1);
    local_48 = (void *)((long)local_48 + (long)in_ESI * 2);
  }
  pvVar3 = (void *)((long)pvVar3 + (long)(in_ESI * (in_ECX + -1)) * 2);
  local_50 = pvVar3;
  for (local_20 = 0; local_20 < (int)dst_ptr2; local_20 = local_20 + 1) {
    local_50 = (void *)((long)local_50 + (long)in_ESI * 2);
    memcpy(local_50,pvVar3,(long)iVar1 << 1);
  }
  return;
}

Assistant:

static void extend_plane_high(uint8_t *const src8, int src_stride, int width,
                              int height, int extend_top, int extend_left,
                              int extend_bottom, int extend_right, int v_start,
                              int v_end) {
  int i;
  const int linesize = extend_left + extend_right + width;
  assert(linesize <= src_stride);
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);

  /* copy the left and right most columns out */
  uint16_t *src_ptr1 = src + v_start * src_stride;
  uint16_t *src_ptr2 = src + v_start * src_stride + width - 1;
  uint16_t *dst_ptr1 = src + v_start * src_stride - extend_left;
  uint16_t *dst_ptr2 = src_ptr2 + 1;

  for (i = v_start; i < v_end; ++i) {
    aom_memset16(dst_ptr1, src_ptr1[0], extend_left);
    aom_memset16(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_stride;
    src_ptr2 += src_stride;
    dst_ptr1 += src_stride;
    dst_ptr2 += src_stride;
  }

  /* Now copy the top and bottom lines into each line of the respective
   * borders
   */
  src_ptr1 = src - extend_left;
  dst_ptr1 = src_ptr1 + src_stride * -extend_top;

  for (i = 0; i < extend_top; ++i) {
    memcpy(dst_ptr1, src_ptr1, linesize * sizeof(uint16_t));
    dst_ptr1 += src_stride;
  }

  src_ptr2 = src_ptr1 + src_stride * (height - 1);
  dst_ptr2 = src_ptr2;

  for (i = 0; i < extend_bottom; ++i) {
    dst_ptr2 += src_stride;
    memcpy(dst_ptr2, src_ptr2, linesize * sizeof(uint16_t));
  }
}